

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

torrent_handle __thiscall libtorrent::aux::torrent::get_handle(torrent *this)

{
  _Atomic_word *p_Var1;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  long in_RSI;
  torrent_handle tVar4;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_30;
  _func_int **local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::aux::torrent,void>
            ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)&local_28,
             (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0xa0));
  local_30._M_pi = local_20;
  _Var3._M_pi = extraout_RDX;
  if (local_20 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (this->super_request_callback)._vptr_request_callback = (_func_int **)0x0;
    (this->super_torrent_hot_members).m_picker._M_t.
    super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
    ._M_t.
    super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
    .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl =
         (piece_picker *)0x0;
    goto LAB_0030e27e;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    local_20->_M_weak_count = local_20->_M_weak_count + 1;
    UNLOCK();
    (this->super_request_callback)._vptr_request_callback = (_func_int **)0x0;
    (this->super_torrent_hot_members).m_picker._M_t.
    super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
    ._M_t.
    super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
    .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl =
         (piece_picker *)0x0;
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0030e21f;
  }
  else {
    local_20->_M_weak_count = local_20->_M_weak_count + 1;
    (this->super_request_callback)._vptr_request_callback = (_func_int **)0x0;
    (this->super_torrent_hot_members).m_picker._M_t.
    super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
    ._M_t.
    super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
    .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl =
         (piece_picker *)0x0;
LAB_0030e21f:
    if (local_20->_M_use_count != 0) {
      (this->super_request_callback)._vptr_request_callback = local_28;
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&this->super_torrent_hot_members,
                 &local_30);
      _Var3._M_pi = extraout_RDX_00;
      if (local_30._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0030e26f;
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_30._M_pi)->_M_weak_count;
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = (local_30._M_pi)->_M_weak_count;
      (local_30._M_pi)->_M_weak_count = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*(local_30._M_pi)->_vptr__Sp_counted_base[3])();
      _Var3._M_pi = extraout_RDX_01;
    }
  }
LAB_0030e26f:
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    _Var3._M_pi = extraout_RDX_02;
  }
LAB_0030e27e:
  tVar4.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var3._M_pi;
  tVar4.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this;
  return (torrent_handle)
         tVar4.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

torrent_handle torrent::get_handle()
	{
		TORRENT_ASSERT(is_single_thread());
		return torrent_handle(shared_from_this());
	}